

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O1

locale __thiscall
booster::locale::impl_posix::create_convert
          (impl_posix *this,locale *in,shared_ptr<__locale_struct_*> *lc,character_facet_type type)

{
  element_type *pp_Var1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  std_converter<char> *__f;
  std_converter<wchar_t> *__f_00;
  utf8_converter *__f_01;
  ulong uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  string encoding;
  allocator local_39;
  undefined1 *local_38;
  ulong local_30;
  undefined1 local_28 [16];
  
  if (type != 2) {
    if (type == 1) {
      pcVar4 = nl_langinfo_l(0xe,(__locale_t)
                                 *(lc->
                                  super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)
                                  ._M_ptr);
      std::__cxx11::string::string((string *)&local_38,pcVar4,&local_39);
      if (local_30 != 0) {
        uVar2 = 1;
        uVar5 = 0;
        do {
          if ((byte)(local_38[uVar5] + 0xbf) < 0x1a) {
            local_38[uVar5] = local_38[uVar5] | 0x20;
          }
          uVar5 = (ulong)uVar2;
          uVar2 = uVar2 + 1;
        } while (uVar5 < local_30);
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_38);
      if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_38), iVar3 == 0))
         || (iVar3 = std::__cxx11::string::compare((char *)&local_38), iVar3 == 0)) {
        __f_01 = (utf8_converter *)operator_new(0x20);
        pp_Var1 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var6 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                 ._M_pi;
        if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          *(undefined4 *)&(__f_01->super_converter<char>).field_0x8 = 0;
          *(undefined ***)&__f_01->super_converter<char> = &PTR__utf8_converter_001d2710;
          (__f_01->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               pp_Var1;
          (__f_01->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
          *(undefined4 *)&(__f_01->super_converter<char>).field_0x8 = 0;
          *(undefined ***)&__f_01->super_converter<char> = &PTR__utf8_converter_001d2710;
          (__f_01->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               pp_Var1;
          (__f_01->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var6;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
        }
        std::locale::locale<booster::locale::impl_posix::utf8_converter>((locale *)this,in,__f_01);
      }
      else {
        __f = (std_converter<char> *)operator_new(0x20);
        pp_Var1 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var6 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                 ._M_pi;
        if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          *(undefined4 *)&(__f->super_converter<char>).field_0x8 = 0;
          *(undefined ***)&__f->super_converter<char> = &PTR__std_converter_001d2750;
          (__f->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               pp_Var1;
          (__f->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
          *(undefined4 *)&(__f->super_converter<char>).field_0x8 = 0;
          *(undefined ***)&__f->super_converter<char> = &PTR__std_converter_001d2750;
          (__f->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               pp_Var1;
          (__f->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = p_Var6;
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
        }
        std::locale::locale<booster::locale::impl_posix::std_converter<char>>((locale *)this,in,__f)
        ;
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      if (local_38 != local_28) {
        operator_delete(local_38);
      }
      return (locale)(_Impl *)this;
    }
    std::locale::locale((locale *)this,in);
    return (locale)(_Impl *)this;
  }
  __f_00 = (std_converter<wchar_t> *)operator_new(0x20);
  pp_Var1 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var6 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(undefined4 *)&(__f_00->super_converter<wchar_t>).field_0x8 = 0;
    *(undefined ***)&__f_00->super_converter<wchar_t> = &PTR__std_converter_001d2790;
    (__f_00->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pp_Var1
    ;
    (__f_00->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
    *(undefined4 *)&(__f_00->super_converter<wchar_t>).field_0x8 = 0;
    *(undefined ***)&__f_00->super_converter<wchar_t> = &PTR__std_converter_001d2790;
    (__f_00->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pp_Var1
    ;
    (__f_00->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var6;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
  }
  std::locale::locale<booster::locale::impl_posix::std_converter<wchar_t>>((locale *)this,in,__f_00)
  ;
  if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return (locale)(_Impl *)this;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_convert( std::locale const &in,
                            booster::shared_ptr<locale_t> lc,
                            character_facet_type type)
{
        switch(type) {
        case char_facet: 
            {
                std::string encoding = nl_langinfo_l(CODESET,*lc);
                for(unsigned i=0;i<encoding.size();i++)
                    if('A'<=encoding[i] && encoding[i]<='Z')
                        encoding[i]=encoding[i]-'A'+'a';
                if(encoding=="utf-8" || encoding=="utf8" || encoding=="utf_8") {
                    return std::locale(in,new utf8_converter(lc));
                }
                return std::locale(in,new std_converter<char>(lc));
            }
        case wchar_t_facet:
            return std::locale(in,new std_converter<wchar_t>(lc));
        default:
            return in;
        }
}